

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkTimeGrant(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  int32_t *piVar1;
  IterationRequest IVar2;
  bool bVar3;
  Time desiredGrantTime;
  long lVar4;
  long lVar5;
  pointer pDVar6;
  GrantDelayMode delayMode;
  bool bVar7;
  byte bVar8;
  uint8_t uVar9;
  MessageProcessingResult MVar10;
  byte bVar11;
  DependencyInfo *dep;
  pointer pDVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  char cVar16;
  char cVar17;
  
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])();
  desiredGrantTime.internalTimeCode = (this->time_exec).internalTimeCode;
  if ((desiredGrantTime.internalTimeCode == 0x7fffffffffffffff) &&
     ((this->time_allow).internalTimeCode == 0x7fffffffffffffff)) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->time_grantBase).internalTimeCode = 0x7fffffffffffffff;
    BaseTimeCoordinator::disconnect(&this->super_BaseTimeCoordinator);
    return HALTED;
  }
  lVar4 = (this->time_block).internalTimeCode;
  if ((lVar4 != 0x7fffffffffffffff && lVar4 <= desiredGrantTime.internalTimeCode) ||
     (((this->super_BaseTimeCoordinator).nonGranting == true &&
      (desiredGrantTime.internalTimeCode < (this->time_requested).internalTimeCode)))) {
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
    goto LAB_00351f9e;
  }
  IVar2 = this->iterating;
  cVar17 = this->needSendAll;
  this->needSendAll = false;
  MVar10 = CONTINUE_PROCESSING;
  if (IVar2 - 1 < 2) {
    lVar4 = (this->time_allow).internalTimeCode;
    if (lVar4 <= desiredGrantTime.internalTimeCode) {
      if (lVar4 == desiredGrantTime.internalTimeCode) {
        lVar5 = (this->time_requested).internalTimeCode;
        if (lVar4 == lVar5) {
          if (((this->info).wait_for_current_time_updates == false) &&
             ((lVar5 <= desiredGrantTime.internalTimeCode ||
              (bVar7 = TimeDependencies::checkIfReadyForTimeGrant
                                 (&(this->super_BaseTimeCoordinator).dependencies,false,
                                  desiredGrantTime,NONE), bVar7)))) goto LAB_00352132;
        }
        else {
          bVar7 = TimeDependencies::checkIfReadyForTimeGrant
                            (&(this->super_BaseTimeCoordinator).dependencies,true,desiredGrantTime,
                             (this->info).wait_for_current_time_updates * '\x02');
          if (bVar7) {
            if (this->hasIterationData == false) {
              lVar4 = (this->time_exec).internalTimeCode;
              if ((this->time_granted).internalTimeCode < lVar4) {
LAB_00352132:
                MVar10 = NEXT_STEP;
              }
              else {
                bVar7 = (this->info).wait_for_current_time_updates;
                bVar3 = (this->info).restrictive_time_policy;
                bVar14 = bVar7 ^ 1;
                bVar8 = 0x32;
                bVar11 = bVar3;
                if (bVar7 == false) {
                  pDVar12 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pDVar6 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (pDVar12 != pDVar6) {
                    bVar8 = 0x32;
                    bVar15 = bVar14;
                    do {
                      cVar16 = '\0';
                      if (((pDVar12->dependency == true) &&
                          ((pDVar12->super_TimeData).next.internalTimeCode <= lVar4)) &&
                         (pDVar12->connection != SELF)) {
                        if ((pDVar12->super_TimeData).minFed.gid !=
                            (this->super_BaseTimeCoordinator).mSourceId.gid) {
                          bVar15 = 0;
                        }
                        bVar7 = (pDVar12->super_TimeData).responseSequenceCounter ==
                                (this->super_BaseTimeCoordinator).sequenceCounter;
                        bVar13 = bVar11;
                        if (!bVar7) {
                          bVar13 = 0;
                        }
                        bVar14 = 0;
                        if (bVar7) {
                          bVar14 = bVar15;
                        }
                        if ((bVar7 & bVar3) == 1) {
                          bVar14 = (pDVar12->super_TimeData).restrictionLevel;
                          if (bVar14 <= bVar8) {
                            bVar8 = bVar14;
                          }
                          cVar16 = '\0';
                          bVar14 = bVar15;
                        }
                        else {
                          cVar16 = !bVar7 * '\x03';
                          bVar11 = bVar13;
                          bVar15 = bVar14;
                        }
                      }
                    } while ((cVar16 == '\0') && (pDVar12 = pDVar12 + 1, pDVar12 != pDVar6));
                  }
                }
                if ((bVar14 & 1) == 0) {
                  if ((bVar11 & 1) != 0) {
                    uVar9 = bVar8 + 1;
LAB_00352301:
                    this->currentRestrictionLevel = uVar9;
                    piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
                    *piVar1 = *piVar1 + 1;
                    cVar17 = '\x01';
                  }
                }
                else {
                  if ((bVar3 == false) || (bVar8 != 0)) goto LAB_00352132;
                  uVar9 = '\x01';
                  if (this->currentRestrictionLevel != '\x01') goto LAB_00352301;
                }
              }
            }
            else {
              MVar10 = ITERATING;
            }
          }
        }
      }
      goto LAB_00352134;
    }
    if (((this->time_granted).internalTimeCode < desiredGrantTime.internalTimeCode) &&
       (this->hasIterationData != true)) {
      if (IVar2 == FORCE_ITERATION) {
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i =
             (this->iteration).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      else {
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i = 0;
        UNLOCK();
        (this->super_BaseTimeCoordinator).sequenceCounter = 0;
      }
      updateTimeGrant(this);
      return (this->iterating == FORCE_ITERATION) * '\x02';
    }
  }
  else {
    if (IVar2 == NO_ITERATIONS) {
      lVar4 = (this->time_allow).internalTimeCode;
      if (desiredGrantTime.internalTimeCode < lVar4) goto LAB_003521ca;
      if (lVar4 == desiredGrantTime.internalTimeCode) {
        bVar7 = (this->info).wait_for_current_time_updates;
        if ((bVar7 == false) &&
           ((this->time_requested).internalTimeCode <= desiredGrantTime.internalTimeCode))
        goto LAB_003521ca;
        delayMode = WAITING;
        if (bVar7 == false) {
          delayMode = desiredGrantTime.internalTimeCode < (this->time_requested).internalTimeCode;
        }
        bVar7 = TimeDependencies::checkIfReadyForTimeGrant
                          (&(this->super_BaseTimeCoordinator).dependencies,false,desiredGrantTime,
                           delayMode);
        if (bVar7) {
          LOCK();
          (this->iteration).super___atomic_base<int>._M_i = 0;
          UNLOCK();
          (this->super_BaseTimeCoordinator).sequenceCounter = 0;
          this->hasIterationData = false;
          updateTimeGrant(this);
          return NEXT_STEP;
        }
      }
    }
LAB_00352134:
    if (MVar10 == NEXT_STEP) {
      if (this->iterating != FORCE_ITERATION) {
LAB_003521ca:
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i = 0;
        UNLOCK();
        (this->super_BaseTimeCoordinator).sequenceCounter = 0;
        this->hasIterationData = false;
        updateTimeGrant(this);
        return NEXT_STEP;
      }
      LOCK();
      (this->iteration).super___atomic_base<int>._M_i =
           (this->iteration).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this->hasIterationData = false;
      (this->time_exec).internalTimeCode = (this->time_granted).internalTimeCode;
      goto LAB_00352193;
    }
    if (MVar10 != ITERATING) {
      if (MVar10 != CONTINUE_PROCESSING) {
        return MVar10;
      }
      if (((triggerFed.gid == -1700000000) || (triggerFed.gid == -2010000000)) && (cVar17 == '\0'))
      {
        return CONTINUE_PROCESSING;
      }
      if (cVar17 != '\0') {
        sendTimeRequest(this,(GlobalFederateId)0x8831d580);
        return CONTINUE_PROCESSING;
      }
LAB_00351f9e:
      if ((this->super_BaseTimeCoordinator).mSourceId.gid == triggerFed.gid) {
        return CONTINUE_PROCESSING;
      }
      sendTimeRequest(this,triggerFed);
      return CONTINUE_PROCESSING;
    }
  }
  LOCK();
  (this->iteration).super___atomic_base<int>._M_i =
       (this->iteration).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this->hasIterationData = false;
LAB_00352193:
  updateTimeGrant(this);
  return ITERATING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkTimeGrant(GlobalFederateId triggerFed)
{
    updateTimeFactors();
    if (time_exec == Time::maxVal()) {
        if (time_allow == Time::maxVal()) {
            time_granted = Time::maxVal();
            time_grantBase = Time::maxVal();
            disconnect();
            return MessageProcessingResult::HALTED;
        }
    }
    if (time_block <= time_exec && time_block < Time::maxVal()) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    if ((nonGranting && time_exec < time_requested)) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    // if ((iterating == IterationRequest::NO_ITERATIONS) ||
    //     (time_exec > time_granted && iterating == IterationRequest::ITERATE_IF_NEEDED)) {
    //
    //     if (time_allow > time_exec) {
    //         iteration = 0;
    //         updateTimeGrant();
    //         return MessageProcessingResult::NEXT_STEP;
    //     }
    //     if (time_allow == time_exec) {
    //         if (!info.wait_for_current_time_updates) {
    //             if (time_requested <= time_exec) {
    //                 // this is the non interrupted case
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //             if (dependencies.checkIfReadyForTimeGrant(false, time_exec)) {
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //         } else {
    //             // if the wait_for_current_time_updates flag is set then time_allow must be
    //             greater
    //             // than time_exec
    //         }
    //     }
    // } else {
    //     if (time_allow > time_exec) {
    //         ++iteration;
    //         updateTimeGrant();
    //         return MessageProcessingResult::ITERATING;
    //     }
    //     if (time_allow == time_exec)  // time_allow==time_exec==time_granted
    //     {
    //         if (dependencies.checkIfReadyForTimeGrant(true, time_exec)) {
    //             ++iteration;
    //             updateTimeGrant();
    //             return MessageProcessingResult::ITERATING;
    //         }
    //     }
    // }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (time_allow > time_exec) {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
                return MessageProcessingResult::NEXT_STEP;
            }
            if (time_allow == time_exec) {
                if (!info.wait_for_current_time_updates) {
                    if (time_requested <= time_exec) {
                        // this is the non interrupted case
                        iteration = 0;
                        sequenceCounter = 0;
                        hasIterationData = false;
                        updateTimeGrant();
                        return MessageProcessingResult::NEXT_STEP;
                    }
                }

                auto delayMode =
                    getDelayMode(info.wait_for_current_time_updates, (time_requested > time_exec));
                if (dependencies.checkIfReadyForTimeGrant(false, time_exec, delayMode)) {
                    iteration = 0;
                    sequenceCounter = 0;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::NEXT_STEP;
                }

                // if the wait_for_current_time_updates flag is set then time_allow must be greater
                // than time_exec
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (time_allow > time_exec) {
                if (time_exec <= time_granted || hasIterationData) {
                    ++iteration;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::ITERATING;
                }
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ++iteration;
                } else {
                    iteration = 0;
                    sequenceCounter = 0;
                }

                updateTimeGrant();
                return (iterating == IterationRequest::FORCE_ITERATION) ?
                    MessageProcessingResult::ITERATING :
                    MessageProcessingResult::NEXT_STEP;
            }

            if (time_allow == time_exec) {
                if (time_allow == time_requested) {
                    if (!info.wait_for_current_time_updates) {
                        if (time_requested <= time_exec) {
                            // this is the non interrupted case
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                        if (dependencies.checkIfReadyForTimeGrant(false,
                                                                  time_exec,
                                                                  GrantDelayMode::NONE)) {
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                    }
                    ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    break;
                }
                if (dependencies.checkIfReadyForTimeGrant(
                        true, time_exec, getDelayMode(info.wait_for_current_time_updates, false))) {
                    if (hasIterationData) {
                        ret = MessageProcessingResult::ITERATING;
                        break;
                    }
                    if (time_exec > time_granted) {
                        ret = MessageProcessingResult::NEXT_STEP;
                        break;
                    }
                    // time_
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.next > time_exec || dep.connection == ConnectionType::SELF) {
                                continue;
                            }

                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }

            break;
        default:
            break;
    }

    switch (ret) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            if (triggerFed.isValid() || sendAll) {
                if (sendAll) {
                    sendTimeRequest(GlobalFederateId{});
                } else {
                    if (triggerFed != mSourceId) {
                        sendTimeRequest(triggerFed);
                    }
                }
            }
            break;
        case MessageProcessingResult::ITERATING:
            ++iteration;
            hasIterationData = false;
            updateTimeGrant();
            break;
        case MessageProcessingResult::NEXT_STEP:
            if (iterating == IterationRequest::FORCE_ITERATION) {
                ++iteration;
                hasIterationData = false;
                time_exec = time_granted;
                updateTimeGrant();
                ret = MessageProcessingResult::ITERATING;
            } else {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
            }
            break;
        default:
            break;
    }

    return ret;
}